

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall
GEO::AdaptiveKdTree::split_kd_node
          (AdaptiveKdTree *this,index_t b,index_t e,double *bbox_min,double *bbox_max,index_t *m,
          coord_index_t *cut_dim,double *cut_val)

{
  uint uVar1;
  ulong uVar2;
  coord_index_t d_1;
  double dVar3;
  double dVar4;
  double dVar5;
  double coord_max;
  double coord_min;
  double local_60;
  uint local_58;
  uint local_54;
  double local_50;
  uint *local_48;
  double local_40;
  double local_38;
  
  dVar5 = -1.0;
  for (uVar2 = 0;
      (byte)(this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc != uVar2;
      uVar2 = uVar2 + 1) {
    dVar3 = bbox_max[uVar2] - bbox_min[uVar2];
    if (bbox_max[uVar2] - bbox_min[uVar2] <= dVar5) {
      dVar3 = dVar5;
    }
    dVar5 = dVar3;
  }
  *cut_dim = '\0';
  dVar5 = dVar5 * 0.999;
  local_60 = -1.0;
  local_48 = m;
  local_40 = dVar5;
  for (uVar2 = 0;
      uVar2 < (byte)(this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc;
      uVar2 = uVar2 + 1) {
    if (dVar5 <= bbox_max[uVar2] - bbox_min[uVar2]) {
      dVar3 = KdTree::spread(&this->super_KdTree,b,e,(coord_index_t)uVar2);
      dVar5 = local_40;
      if (local_60 < dVar3) {
        *cut_dim = (coord_index_t)uVar2;
        local_60 = dVar3;
      }
    }
  }
  uVar2 = (ulong)((uint)*cut_dim * 8);
  dVar3 = (*(double *)((long)bbox_min + uVar2) + *(double *)((long)bbox_max + uVar2)) * 0.5;
  KdTree::get_minmax(&this->super_KdTree,b,e,*cut_dim,&local_38,&local_50);
  *cut_val = dVar3;
  dVar5 = local_38;
  if ((dVar3 < local_38) || (dVar4 = dVar3, dVar5 = local_50, local_50 < dVar3)) {
    dVar4 = dVar5;
    *cut_val = dVar4;
  }
  (*(this->super_KdTree).super_NearestNeighborSearch.super_Counted._vptr_Counted[0xf])
            (dVar4,this,b,(ulong)e,(ulong)*cut_dim,&local_54,&local_58);
  uVar1 = (e - b >> 1) + b;
  *local_48 = uVar1;
  if (local_38 <= dVar3) {
    if (dVar3 <= local_50) {
      if ((local_54 <= uVar1) && (local_54 = local_58, uVar1 <= local_58)) {
        return;
      }
    }
    else {
      local_54 = e - 1;
    }
  }
  else {
    local_54 = b + 1;
  }
  *local_48 = local_54;
  return;
}

Assistant:

void AdaptiveKdTree::split_kd_node(
        index_t b, index_t e,
	double* bbox_min, double* bbox_max,
	index_t& m, coord_index_t& cut_dim, double& cut_val	
    ) {
	// Like "sliding midpoint split" in ANN.
	
	const double ERR=0.001;
	
	// Find length of longest box size
	double max_length = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    max_length = std::max(max_length, length);
	}

	// Cutting coordinate
	cut_dim=0;
	
	// Find long side with most spread
	double max_spread = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    // Is it among longest ?
	    if(length >= (1.0 - ERR)*max_length) {
		double spr = spread(b, e, d);
		if(spr > max_spread) {
		    max_spread = spr;
		    cut_dim = d;
		}
	    }
	}

	double ideal_cut_val = 0.5*(bbox_min[cut_dim] + bbox_max[cut_dim]);

	double coord_min, coord_max;
	get_minmax(b, e, cut_dim, coord_min, coord_max);

	cut_val = ideal_cut_val;
	
	// Make it slide if need be.
	if(ideal_cut_val < coord_min) {
	    cut_val = coord_min;
	} else if (ideal_cut_val > coord_max) {
	    cut_val = coord_max;
	}
	
	index_t br1,br2;
	plane_split(b,e,cut_dim,cut_val,br1,br2);

	index_t m0 = b + (e-b)/2;
	m = m0;
	
	if(ideal_cut_val < coord_min) {
	    m = b+1;
	} else if(ideal_cut_val > coord_max) {
	    m = e-1;
	} else if(br1 > m0) {
	    m = br1;
	} else if(br2 < m0) {
	    m = br2;
	} 
    }